

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

void __thiscall
directed_flag_complex_t::worker_thread<directed_flag_complex_computer::add_cell_index_to_cache_t>
          (directed_flag_complex_t *this,size_t number_of_threads,int thread_id,
          add_cell_index_to_cache_t *f,int min_dimension,int max_dimension)

{
  vertex_index_t vVar1;
  allocator_type *__a;
  add_cell_index_to_cache_t *in_RCX;
  int in_EDX;
  vertex_index_t *in_RSI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RDI;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  add_cell_index_to_cache_t *in_stack_00000008;
  directed_flag_complex_t *in_stack_00000010;
  unsigned_short in_stack_00000020;
  vector<unsigned_short,_std::allocator<unsigned_short>_> prefix;
  size_t index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> first_position_vertices;
  size_t number_of_vertices;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff50;
  undefined1 *__n;
  undefined1 local_81 [47];
  undefined2 local_52;
  ulong local_50;
  ulong local_30;
  int local_28;
  add_cell_index_to_cache_t *local_20;
  int local_14;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices;
  
  local_28 = in_R9D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  possible_next_vertices = in_RDI;
  vVar1 = directed_graph_t::vertex_number
                    ((directed_graph_t *)
                     (in_RDI->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  local_30 = (ulong)vVar1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1b4fb0);
  for (local_50 = (ulong)local_14; local_50 < local_30; local_50 = (long)in_RSI + local_50) {
    local_52 = (undefined2)local_50;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (in_stack_ffffffffffffff50,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
              );
  }
  __a = (allocator_type *)(long)(local_28 + 1);
  __n = local_81;
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x1b502f);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(in_RDI,(size_type)__n,__a);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x1b504f);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1b507c);
  do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
             possible_next_vertices,in_RSI,in_stack_00000020);
  directed_flag_complex_computer::add_cell_index_to_cache_t::done(local_20);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)__a);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)__a);
  return;
}

Assistant:

void worker_thread(size_t number_of_threads, int thread_id, Func& f, int min_dimension, int max_dimension) {
		const size_t number_of_vertices = graph.vertex_number();

		std::vector<vertex_index_t> first_position_vertices;
		for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads)
			first_position_vertices.push_back(vertex_index_t(index));

		std::vector<vertex_index_t> prefix(max_dimension + 1);

		do_for_each_cell(f, min_dimension, max_dimension, first_position_vertices, prefix.data(), 0);

		f.done();
	}